

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool google::ParseSubstitution(State *state)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  char cVar4;
  long *plVar5;
  char *pcStack_48;
  State copy;
  
  pcVar1 = state->mangled_cur;
  if (*pcVar1 == 'S') {
    if (pcVar1[1] == '_') {
      state->mangled_cur = pcVar1 + 2;
LAB_0012e60e:
      MaybeAppend(state,"?");
      return true;
    }
    pcStack_48 = state->mangled_cur;
    copy.mangled_cur = state->out_cur;
    copy.out_cur = state->out_begin;
    copy.out_begin = state->out_end;
    copy.out_end = state->prev_name;
    copy.prev_name = *(char **)&state->prev_name_length;
    state->mangled_cur = pcVar1 + 1;
    cVar4 = pcVar1[1];
    if (cVar4 != '\0') {
      lVar3 = 1;
      do {
        if (9 < (byte)(cVar4 - 0x30U) && 0x19 < (byte)(cVar4 + 0xbfU)) {
          if (lVar3 == 1) goto LAB_0012e638;
          break;
        }
        cVar4 = pcVar1[lVar3 + 1];
        lVar3 = lVar3 + 1;
      } while (cVar4 != '\0');
      state->mangled_cur = pcVar1 + lVar3;
      if (pcVar1[lVar3] == '_') {
        state->mangled_cur = pcVar1 + lVar3 + 1;
        goto LAB_0012e60e;
      }
    }
  }
  else {
    pcStack_48 = state->mangled_cur;
    copy.mangled_cur = state->out_cur;
    copy.out_cur = state->out_begin;
    copy.out_begin = state->out_end;
    copy.out_end = state->prev_name;
    copy.prev_name = *(char **)&state->prev_name_length;
  }
LAB_0012e638:
  state->mangled_cur = pcStack_48;
  state->out_cur = copy.mangled_cur;
  state->out_begin = copy.out_cur;
  state->out_end = copy.out_begin;
  state->out_begin = copy.out_cur;
  state->out_end = copy.out_begin;
  state->prev_name = copy.out_end;
  *(char **)&state->prev_name_length = copy.prev_name;
  pcVar1 = state->mangled_cur;
  if (*pcVar1 == 'S') {
    plVar5 = (long *)(kSubstitutionList + 0x10);
    state->mangled_cur = pcVar1 + 1;
    pcVar2 = "St";
    do {
      if (pcVar1[1] == pcVar2[1]) {
        MaybeAppend(state,"std");
        pcVar1 = (char *)plVar5[-1];
        if (*pcVar1 != '\0') {
          MaybeAppend(state,"::");
          MaybeAppend(state,pcVar1);
        }
        state->mangled_cur = state->mangled_cur + 1;
        return true;
      }
      pcVar2 = (char *)*plVar5;
      plVar5 = plVar5 + 2;
    } while (pcVar2 != (char *)0x0);
  }
  state->out_begin = copy.out_cur;
  state->out_end = copy.out_begin;
  state->prev_name = copy.out_end;
  *(char **)&state->prev_name_length = copy.prev_name;
  state->mangled_cur = pcStack_48;
  state->out_cur = copy.mangled_cur;
  state->out_begin = copy.out_cur;
  state->out_end = copy.out_begin;
  return false;
}

Assistant:

static bool ParseSubstitution(State *state) {
  if (ParseTwoCharToken(state, "S_")) {
    MaybeAppend(state, "?");  // We don't support substitutions.
    return true;
  }

  State copy = *state;
  if (ParseOneCharToken(state, 'S') && ParseSeqId(state) &&
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "?");  // We don't support substitutions.
    return true;
  }
  *state = copy;

  // Expand abbreviations like "St" => "std".
  if (ParseOneCharToken(state, 'S')) {
    const AbbrevPair *p;
    for (p = kSubstitutionList; p->abbrev != NULL; ++p) {
      if (state->mangled_cur[0] == p->abbrev[1]) {
        MaybeAppend(state, "std");
        if (p->real_name[0] != '\0') {
          MaybeAppend(state, "::");
          MaybeAppend(state, p->real_name);
        }
        ++state->mangled_cur;
        return true;
      }
    }
  }
  *state = copy;
  return false;
}